

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O0

IsRequestHandlerWithoutCallback<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmDebuggerAdapter_cxx:251:28)>
 __thiscall
dap::Session::
registerHandler<cmDebugger::cmDebuggerAdapter::cmDebuggerAdapter(std::shared_ptr<cmDebugger::cmDebuggerConnection>,std::optional<std::shared_ptr<dap::Writer>>)::__12,dap::LaunchRequest>
          (Session *this,anon_class_1_0_00000001_for_handler *handler)

{
  TypeInfo *pTVar1;
  anon_class_1_1_aca58a2a local_41;
  function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>
  local_40;
  TypeInfo *local_20;
  TypeInfo *typeinfo;
  anon_class_1_0_00000001_for_handler *handler_local;
  Session *this_local;
  
  typeinfo = (TypeInfo *)handler;
  handler_local = (anon_class_1_0_00000001_for_handler *)this;
  pTVar1 = TypeOf<dap::LaunchRequest>::type();
  local_20 = pTVar1;
  std::
  function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>
  ::
  function<dap::Session::registerHandler<cmDebugger::cmDebuggerAdapter::cmDebuggerAdapter(std::shared_ptr<cmDebugger::cmDebuggerConnection>,std::optional<std::shared_ptr<dap::Writer>>)::__12,dap::LaunchRequest>(cmDebugger::cmDebuggerAdapter::cmDebuggerAdapter(std::shared_ptr<cmDebugger::cmDebuggerConnection>,std::optional<std::shared_ptr<dap::Writer>>)::__12&&)::_lambda(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)_1_,void>
            ((function<void(void_const*,std::function<void(dap::TypeInfo_const*,void_const*)>const&,std::function<void(dap::TypeInfo_const*,dap::Error_const&)>const&)>
              *)&local_40,&local_41);
  (*this->_vptr_Session[7])(this,pTVar1,&local_40);
  std::
  function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>
  ::~function(&local_40);
  return;
}

Assistant:

Session::IsRequestHandlerWithoutCallback<F> Session::registerHandler(
    F&& handler) {
  using ResponseType = typename RequestType::Response;
  const TypeInfo* typeinfo = TypeOf<RequestType>::type();
  registerHandler(typeinfo,
                  [handler](const void* args,
                            const RequestHandlerSuccessCallback& onSuccess,
                            const RequestHandlerErrorCallback& onError) {
                    ResponseOrError<ResponseType> res =
                        handler(*reinterpret_cast<const RequestType*>(args));
                    if (res.error) {
                      onError(TypeOf<ResponseType>::type(), res.error);
                    } else {
                      onSuccess(TypeOf<ResponseType>::type(), &res.response);
                    }
                  });
}